

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.h
# Opt level: O2

callback<int_()> __thiscall
cppcms::plugin::manager::entry<int()>(manager *this,string *plugin_name,string *entry_name)

{
  string *psVar1;
  code *pcVar2;
  cppcms_error *pcVar3;
  signature_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  intrusive_ptr<booster::callable<int_()>_> iStack_118;
  pointer_type ptr;
  refcounted_ptr call;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  psVar1 = (string *)cppcms::plugin::manager::instance();
  pcVar2 = (code *)cppcms::plugin::manager::get_entry(psVar1,(string *)entry_name);
  if (pcVar2 == (code *)0x0) {
    pcVar3 = (cppcms_error *)__cxa_allocate_exception(0x30);
    std::operator+(&local_e8,"Could not find entry `",in_RCX);
    std::operator+(&local_c8,&local_e8,"\' in plugin `");
    std::operator+(&local_a8,&local_c8,entry_name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ptr,
                   &local_a8,"\'");
    cppcms_error::cppcms_error(pcVar3,(string *)&ptr);
    __cxa_throw(pcVar3,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  (*pcVar2)(&call);
  if (_call != 0) {
    ptr.p_ = (callable<int_()> *)
             __dynamic_cast(_call,&booster::refcounted::typeinfo,&booster::callable<int()>::typeinfo
                            ,0);
    if (ptr.p_ != (callable<int_()> *)0x0) {
      booster::atomic_counter::inc();
      booster::intrusive_ptr<booster::callable<int_()>_>::intrusive_ptr(&iStack_118,&ptr);
      booster::intrusive_ptr<booster::callable<int_()>_>::intrusive_ptr
                ((intrusive_ptr<booster::callable<int_()>_> *)this,&iStack_118);
      booster::intrusive_ptr<booster::callable<int_()>_>::~intrusive_ptr(&iStack_118);
      booster::intrusive_ptr<booster::callable<int_()>_>::~intrusive_ptr(&ptr);
      booster::intrusive_ptr<booster::refcounted>::~intrusive_ptr(&call);
      return (callback<int_()>)(pointer_type)this;
    }
    this_00 = (signature_error *)__cxa_allocate_exception(0x48);
    std::operator+(&local_68,"Invalid signature request in plugin `",entry_name);
    std::operator+(&local_48,&local_68,"\':entry `");
    std::operator+(&local_e8,&local_48,in_RCX);
    std::operator+(&local_c8,&local_e8,"\', expected following signaure `");
    psVar1 = (string *)cppcms::plugin::manager::instance();
    cppcms::plugin::manager::signature((string *)&local_88,psVar1);
    std::operator+(&local_a8,&local_c8,&local_88);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ptr,
                   &local_a8,"\'");
    cppcms::plugin::signature_error::signature_error(this_00,(string *)&ptr);
    __cxa_throw(this_00,&signature_error::typeinfo,cppcms::plugin::signature_error::~signature_error
               );
  }
  pcVar3 = (cppcms_error *)__cxa_allocate_exception(0x30);
  std::operator+(&local_e8,"Failed to create callback from plugin `",entry_name);
  std::operator+(&local_c8,&local_e8,"\':entry `");
  std::operator+(&local_a8,&local_c8,in_RCX);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ptr,&local_a8
                 ,"\'");
  cppcms_error::cppcms_error(pcVar3,(string *)&ptr);
  __cxa_throw(pcVar3,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

booster::callback<Signature>
	entry(std::string const &plugin_name,std::string const &entry_name)
	{
		typedef booster::callback<Signature> callback_type;
		typedef typename callback_type::callable_type callable_type;
		typedef typename callback_type::pointer_type pointer_type;

		entry_point_type plugin_call = instance().get_entry(plugin_name,entry_name);
		if(!plugin_call)
			throw cppcms_error("Could not find entry `" + entry_name + "' in plugin `" + plugin_name + "'");
		refcounted_ptr call = plugin_call();
		if(!call)
			throw cppcms_error("Failed to create callback from plugin `"+plugin_name+"':entry `" + entry_name + "'");

		callable_type *real_call = dynamic_cast<callable_type *>(call.get());
		if(!real_call) {
			throw signature_error("Invalid signature request in plugin `"+ plugin_name +"':entry `"+entry_name+"', expected following signaure `" + instance().signature(plugin_name,entry_name) + "'");
		}
		pointer_type ptr(real_call);
		callback_type result(ptr);
		return result;
	}